

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O1

void __thiscall TRM::TinyRender::attachBuffer(TinyRender *this,TGAImage *image)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  
  this->mImage = image;
  if (((image != (TGAImage *)0x0) && (iVar1 = TGAImage::get_width(image), 0 < iVar1)) &&
     (iVar1 = TGAImage::get_height(this->mImage), 0 < iVar1)) {
    if (this->mZBuffer != (float *)0x0) {
      operator_delete__(this->mZBuffer);
      this->mZBuffer = (float *)0x0;
    }
    iVar1 = TGAImage::get_width(this->mImage);
    iVar2 = TGAImage::get_height(this->mImage);
    iVar2 = iVar2 * iVar1;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = (long)iVar2 * 4;
    }
    pfVar3 = (float *)operator_new__(uVar5);
    this->mZBuffer = pfVar3;
    if (iVar2 != 0) {
      lVar4 = 0;
      do {
        pfVar3[lVar4] = 3.4028235e+38;
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
    }
  }
  return;
}

Assistant:

void TinyRender::attachBuffer(TGAImage* image) {
  mImage = image;
  if (mImage != nullptr && mImage->get_width() > 0 &&
      mImage->get_height() > 0) {
    if (mZBuffer != nullptr) {
      delete[] mZBuffer;
      mZBuffer = nullptr;
    }

    int width = mImage->get_width();
    int height = mImage->get_height();
    mZBuffer = new float[width * height];
    for (size_t i = 0; i < width * height; i++) {
      mZBuffer[i] = std::numeric_limits<float>::max();
    }
  }
}